

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

Own<const_kj::File> __thiscall
kj::anon_unknown_8::DiskDirectory::createTemporary(DiskDirectory *this)

{
  PathPtr finalName;
  kj kVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Iface *pIVar4;
  int iVar5;
  long lVar6;
  AutoCloseFd AVar7;
  AutoCloseFd AVar8;
  Clock *clock;
  File *extraout_RDX;
  File *extraout_RDX_00;
  File *extraout_RDX_01;
  File *pFVar9;
  File *ptrCopy;
  long in_RSI;
  char *ptrCopy_1;
  undefined8 uVar10;
  DiskHandle *this_00;
  size_t sizeCopy;
  undefined8 uVar11;
  Own<kj::File> OVar12;
  Own<const_kj::File> OVar13;
  StringPtr name;
  int newFd_;
  Fault f;
  AutoCloseFd newFd_1;
  AutoCloseFd newFd;
  Fault f_1;
  int local_c4;
  AutoCloseFd local_c0;
  undefined1 local_b8 [8];
  anon_union_24_1_a8c68091_for_NullableValue<kj::String>_2 aStack_b0;
  undefined1 local_98 [4];
  UnwindDetector UStack_94;
  AutoCloseFd AStack_90;
  ArrayDisposer *local_88;
  Function<int_(kj::StringPtr)> local_78;
  AutoCloseFd local_68;
  AutoCloseFd AStack_60;
  size_t sStack_58;
  ArrayDisposer *local_50;
  ArrayDisposer *local_40;
  Fault local_38;
  
  this_00 = (DiskHandle *)(in_RSI + 8);
  do {
    lVar6 = syscall(0x101,(ulong)(uint)(this_00->fd).fd,".",0x410002,0x1c0);
    local_c4 = (int)lVar6;
    if (-1 < local_c4) goto LAB_00219144;
    iVar5 = _::Debug::getOsErrorNumber(false);
  } while (iVar5 == -1);
  if (1 < iVar5 - 0x15U) {
    if (iVar5 == 0) {
LAB_00219144:
      local_68.fd = local_c4;
      UnwindDetector::UnwindDetector(&local_68.unwindDetector);
      local_b8._0_4_ = local_68.fd;
      UnwindDetector::UnwindDetector((UnwindDetector *)(local_b8 + 4));
      local_68.fd = -1;
      AVar7 = (AutoCloseFd)operator_new(0x10);
      *(undefined ***)AVar7 = &PTR_getFd_0027f8d8;
      *(undefined4 *)((long)AVar7 + 8) = local_b8._0_4_;
      UnwindDetector::UnwindDetector((UnwindDetector *)((long)AVar7 + 0xc));
      local_b8._0_4_ = -1;
      *(undefined ***)AVar7 = &PTR_getFd_00280318;
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
           (_func_int **)&_::HeapDisposer<kj::(anonymous_namespace)::DiskFile>::instance;
      (this->super_DiskHandle).fd = AVar7;
      AutoCloseFd::~AutoCloseFd((AutoCloseFd *)local_b8);
      AutoCloseFd::~AutoCloseFd(&local_68);
      pFVar9 = extraout_RDX;
      goto LAB_00219487;
    }
    if (iVar5 != 0x5f) {
      local_b8._0_4_ = 0;
      local_b8._4_4_ = 0;
      local_68.fd = 0;
      local_68.unwindDetector.uncaughtCount = 0;
      AStack_60.fd = 0;
      AStack_60.unwindDetector.uncaughtCount = 0;
      _::Debug::Fault::init
                ((Fault *)local_b8,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                );
      _::Debug::Fault::~Fault((Fault *)local_b8);
    }
  }
  name.content.size_ = 8;
  name.content.ptr = "unnamed";
  Path::Path((Path *)local_98,name);
  uVar10 = AStack_90;
  uVar11 = CONCAT44(UStack_94.uncaughtCount,local_98);
  finalName.parts.ptr._4_4_ = UStack_94.uncaughtCount;
  finalName.parts.ptr._0_4_ = local_98;
  finalName.parts.size_._0_4_ = AStack_90.fd;
  finalName.parts.size_._4_4_ = AStack_90.unwindDetector.uncaughtCount;
  local_78.impl.ptr = (Iface *)operator_new(0x18);
  (local_78.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00280818;
  local_78.impl.ptr[1]._vptr_Iface = (_func_int **)&local_c4;
  local_78.impl.ptr[2]._vptr_Iface = (_func_int **)this_00;
  local_78.impl.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::Function<int(kj::StringPtr)>::Impl<kj::(anonymous_namespace)::DiskHandle::createTemporary()const::{lambda(kj::StringPtr)#1}>>
        ::instance;
  DiskHandle::createNamedTemporary((Maybe<kj::String> *)local_b8,this_00,finalName,CREATE,&local_78)
  ;
  pIVar4 = local_78.impl.ptr;
  uVar3 = aStack_b0.value.content.size_;
  uVar2 = aStack_b0.value.content.ptr;
  kVar1 = local_b8[0];
  local_68.fd._0_1_ = local_b8[0];
  if (local_b8[0] == (kj)0x1) {
    AStack_60 = (AutoCloseFd)aStack_b0.value.content.ptr;
    sStack_58 = aStack_b0.value.content.size_;
    local_40 = aStack_b0.value.content.disposer;
    local_50 = aStack_b0.value.content.disposer;
    aStack_b0.value.content.ptr = (char *)0x0;
    aStack_b0.value.content.size_ = 0;
    uVar10 = uVar2;
    uVar11 = uVar3;
  }
  if (local_78.impl.ptr != (Iface *)0x0) {
    local_78.impl.ptr = (Iface *)0x0;
    (**(local_78.impl.disposer)->_vptr_Disposer)
              (local_78.impl.disposer,pIVar4->_vptr_Iface[-2] + (long)&pIVar4->_vptr_Iface);
  }
  AVar7 = AStack_90;
  lVar6 = CONCAT44(UStack_94.uncaughtCount,local_98);
  if (lVar6 != 0) {
    local_98 = (undefined1  [4])0x0;
    UStack_94.uncaughtCount = 0;
    AStack_90.fd = 0;
    AStack_90.unwindDetector.uncaughtCount = 0;
    (**local_88->_vptr_ArrayDisposer)
              (local_88,lVar6,0x18,AVar7,AVar7,ArrayDisposer::Dispose_<kj::String,_false>::destruct)
    ;
  }
  if (kVar1 == (kj)0x0) {
    clock = nullClock();
    OVar12 = newInMemoryFile((kj *)local_b8,clock);
    pFVar9 = OVar12.ptr;
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
         (_func_int **)local_b8;
    (this->super_DiskHandle).fd = (AutoCloseFd)aStack_b0.value.content.ptr;
  }
  else {
    local_98 = (undefined1  [4])local_c4;
    UnwindDetector::UnwindDetector(&UStack_94);
    local_c0.fd = (int)local_98;
    UnwindDetector::UnwindDetector(&local_c0.unwindDetector);
    local_98 = (undefined1  [4])0xffffffff;
    AVar8 = (AutoCloseFd)operator_new(0x10);
    *(undefined ***)AVar8 = &PTR_getFd_0027f8d8;
    *(int *)((long)AVar8 + 8) = local_c0.fd;
    UnwindDetector::UnwindDetector((UnwindDetector *)((long)AVar8 + 0xc));
    local_c0.fd = -1;
    *(undefined ***)AVar8 = &PTR_getFd_00280318;
    AutoCloseFd::~AutoCloseFd(&local_c0);
    AVar7 = (AutoCloseFd)((long)"();\n\n" + 5);
    if (uVar11 != 0) {
      AVar7 = (AutoCloseFd)uVar10;
    }
    do {
      iVar5 = unlinkat((this_00->fd).fd,(char *)AVar7,0);
      if (-1 < iVar5) goto LAB_00219425;
      iVar5 = _::Debug::getOsErrorNumber(false);
    } while (iVar5 == -1);
    if (iVar5 != 0) {
      local_38.exception = (Exception *)0x0;
      local_b8._0_4_ = 0;
      local_b8._4_4_ = 0;
      aStack_b0.value.content.ptr = (char *)0x0;
      _::Debug::Fault::init
                (&local_38,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                );
      _::Debug::Fault::~Fault(&local_38);
    }
LAB_00219425:
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
         (_func_int **)&_::HeapDisposer<kj::(anonymous_namespace)::DiskFile>::instance;
    (this->super_DiskHandle).fd = AVar8;
    AutoCloseFd::~AutoCloseFd((AutoCloseFd *)local_98);
    pFVar9 = extraout_RDX_00;
    if ((AutoCloseFd)uVar10 != (AutoCloseFd)0x0) {
      AStack_60.fd = 0;
      AStack_60.unwindDetector.uncaughtCount = 0;
      sStack_58 = 0;
      (**local_40->_vptr_ArrayDisposer)(local_40,uVar10,1,uVar11,uVar11,0);
      pFVar9 = extraout_RDX_01;
    }
  }
LAB_00219487:
  OVar13.ptr = pFVar9;
  OVar13.disposer = (Disposer *)this;
  return OVar13;
}

Assistant:

Own<const File> createTemporary() const override {
    return DiskHandle::createTemporary();
  }